

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O0

void DumpConstants(Proto *f,DumpState *D)

{
  int x;
  TValue *pTVar1;
  TValue *o;
  int n;
  int i;
  DumpState *D_local;
  Proto *f_local;
  
  x = f->sizek;
  DumpInt(x,D);
  for (o._4_4_ = 0; o._4_4_ < x; o._4_4_ = o._4_4_ + 1) {
    pTVar1 = f->k + o._4_4_;
    DumpByte(pTVar1->tt_ & 0x3f,D);
    switch(pTVar1->tt_ & 0x3f) {
    case 0:
      break;
    case 1:
      DumpByte((pTVar1->value_).b,D);
      break;
    default:
      break;
    case 3:
      DumpNumber((pTVar1->value_).n,D);
      break;
    case 4:
    case 0x14:
      DumpString((TString *)(pTVar1->value_).gc,D);
      break;
    case 0x13:
      DumpInteger((pTVar1->value_).i,D);
    }
  }
  return;
}

Assistant:

static void DumpConstants(const Proto *f, DumpState *D) {
    int i;
    int n = f->sizek;
    DumpInt(n, D);
    for (i = 0; i < n; i++) {
        const TValue *o = &f->k[i];
        DumpByte(ttype(o), D);
        switch (ttype(o)) {
            case LUA_TNIL:
                break;
            case LUA_TBOOLEAN:
                DumpByte(bvalue(o), D);
                break;
            case LUA_TNUMFLT:
                DumpNumber(fltvalue(o), D);
                break;
            case LUA_TNUMINT:
                DumpInteger(ivalue(o), D);
                break;
            case LUA_TSHRSTR:
            case LUA_TLNGSTR:
                DumpString(tsvalue(o), D);
                break;
            default:
                lua_assert(0);
        }
    }
}